

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O1

ostream * operator<<(ostream *os,Token *token)

{
  pointer pcVar1;
  char *pcVar2;
  string local_38;
  
  pcVar2 = (char *)&local_38;
  switch(token->mType) {
  case NUMBER:
    NumericConstant::toString_abi_cxx11_(&local_38,&token->mNumericValue);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_38._M_dataplus._M_p,local_38._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      return os;
    }
    goto LAB_00127a6d;
  case OPERATOR:
    local_38._M_dataplus._M_p._0_1_ = token->mCharValue;
    break;
  default:
    goto switchD_00127a03_caseD_2;
  case IDENTIFIER:
    pcVar1 = (token->mIdentifier)._M_dataplus._M_p;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + (token->mIdentifier)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_38._M_dataplus._M_p,local_38._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      return os;
    }
LAB_00127a6d:
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    return os;
  case LEFT_PARENTHESIS:
    pcVar2 = "(";
    break;
  case RIGHT_PARENTHESIS:
    pcVar2 = ")";
    break;
  case COMMA:
    pcVar2 = ",";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,1);
switchD_00127a03_caseD_2:
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Token& token) {
	switch (token.type()) {
		case TokenType::NUMBER:
			os << token.numericValue().toString();
			break;
		case TokenType::OPERATOR:
			os << token.charValue();
			break;
		case TokenType::IDENTIFIER:
			os << token.identifier();
			break;
		case TokenType::LEFT_PARENTHESIS:
			os << "(";
			break;
		case TokenType::RIGHT_PARENTHESIS:
			os << ")";
			break;
		case TokenType::COMMA:
			os << ",";
			break;
		default:
			break;
	}

	return os;
}